

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall BackwardPass::InsertArgInsForFormals(BackwardPass *this)

{
  Func *this_00;
  code *pcVar1;
  bool bVar2;
  IRKind IVar3;
  ArgSlot AVar4;
  uint16 uVar5;
  uint uVar6;
  JITTimeFunctionBody *pJVar7;
  undefined4 *puVar8;
  StackSym *stackSym;
  StackSym *sym;
  RegOpnd *dstOpnd_00;
  SymOpnd *src1Opnd;
  Instr *instr;
  char16 *pcVar9;
  bool local_61;
  RegOpnd *dstOpnd;
  StackSym *symDst;
  StackSym *symSrc;
  SymOpnd *srcOpnd;
  ArgSlot argumentIndex;
  Instr *argInInstr;
  Instr *pIStack_20;
  ArgSlot paramsCount;
  Instr *insertAfterInstr;
  BackwardPass *this_local;
  
  bVar2 = Func::IsStackArgsEnabled(this->func);
  if (bVar2) {
    pJVar7 = Func::GetJITFunctionBody(this->func);
    bVar2 = JITTimeFunctionBody::HasImplicitArgIns(pJVar7);
    if (!bVar2) {
      pIStack_20 = this->func->m_headInstr->m_next;
      IVar3 = IR::Instr::GetKind(pIStack_20);
      local_61 = true;
      if (IVar3 != InstrKindLabel) {
        local_61 = IR::Instr::IsProfiledLabelInstr(pIStack_20);
      }
      if (local_61 == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x114,"(insertAfterInstr->IsLabelInstr())",
                           "First Instr of the first block should always have a label");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      pJVar7 = Func::GetJITFunctionBody(pIStack_20->m_func);
      AVar4 = JITTimeFunctionBody::GetInParamsCount(pJVar7);
      for (srcOpnd._6_2_ = 1; srcOpnd._6_2_ <= (ushort)(AVar4 - 1);
          srcOpnd._6_2_ = srcOpnd._6_2_ + 1) {
        stackSym = StackSym::NewParamSlotSym(srcOpnd._6_2_ + 1,this->func);
        sym = StackSym::New(this->func);
        dstOpnd_00 = IR::RegOpnd::New(sym,TyVar,this->func);
        this_00 = this->func;
        uVar5 = LowererMD::GetFormalParamOffset();
        Func::SetArgOffset(this_00,stackSym,((uint)srcOpnd._6_2_ + (uint)uVar5) * 8);
        src1Opnd = IR::SymOpnd::New(&stackSym->super_Sym,TyVar,this->func);
        instr = IR::Instr::New(ArgIn_A,&dstOpnd_00->super_Opnd,&src1Opnd->super_Opnd,this->func);
        IR::Instr::InsertAfter(pIStack_20,instr);
        bVar2 = Func::HasStackSymForFormal(this->func,srcOpnd._6_2_ - 1);
        if (bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x127,"(!func->HasStackSymForFormal(argumentIndex - 1))",
                             "Already has a stack sym for this formal?");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        Func::TrackStackSymForFormalIndex(this->func,srcOpnd._6_2_ - 1,sym);
        pIStack_20 = instr;
      }
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,StackArgFormalsOptPhase);
      if (((bVar2) && ((DAT_01ec73ca & 1) != 0)) && (AVar4 != 1)) {
        pJVar7 = Func::GetJITFunctionBody(this->func);
        pcVar9 = JITTimeFunctionBody::GetDisplayName(pJVar7);
        uVar6 = Func::GetFunctionNumber(this->func);
        Output::Print(L"StackArgFormals : %s (%d) :Inserting ArgIn_A for LdSlot (formals) in the start of Deadstore pass. \n"
                      ,pcVar9,(ulong)uVar6);
        Output::Flush();
      }
    }
  }
  return;
}

Assistant:

void
BackwardPass::InsertArgInsForFormals()
{
    if (func->IsStackArgsEnabled() && !func->GetJITFunctionBody()->HasImplicitArgIns())
    {
        IR::Instr * insertAfterInstr = func->m_headInstr->m_next;
        AssertMsg(insertAfterInstr->IsLabelInstr(), "First Instr of the first block should always have a label");

        Js::ArgSlot paramsCount = insertAfterInstr->m_func->GetJITFunctionBody()->GetInParamsCount() - 1;
        IR::Instr *     argInInstr = nullptr;
        for (Js::ArgSlot argumentIndex = 1; argumentIndex <= paramsCount; argumentIndex++)
        {
            IR::SymOpnd *   srcOpnd;
            StackSym *      symSrc = StackSym::NewParamSlotSym(argumentIndex + 1, func);
            StackSym *      symDst = StackSym::New(func);
            IR::RegOpnd * dstOpnd = IR::RegOpnd::New(symDst, TyVar, func);

            func->SetArgOffset(symSrc, (argumentIndex + LowererMD::GetFormalParamOffset()) * MachPtr);

            srcOpnd = IR::SymOpnd::New(symSrc, TyVar, func);

            argInInstr = IR::Instr::New(Js::OpCode::ArgIn_A, dstOpnd, srcOpnd, func);
            insertAfterInstr->InsertAfter(argInInstr);
            insertAfterInstr = argInInstr;

            AssertMsg(!func->HasStackSymForFormal(argumentIndex - 1), "Already has a stack sym for this formal?");
            this->func->TrackStackSymForFormalIndex(argumentIndex - 1, symDst);
        }

        if (PHASE_VERBOSE_TRACE1(Js::StackArgFormalsOptPhase) && paramsCount > 0)
        {
            Output::Print(_u("StackArgFormals : %s (%d) :Inserting ArgIn_A for LdSlot (formals) in the start of Deadstore pass. \n"), func->GetJITFunctionBody()->GetDisplayName(), func->GetFunctionNumber());
            Output::Flush();
        }
    }
}